

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O2

void __thiscall
sentencepiece::bpe::Trainer::ResetFreq(Trainer *this,int sid,int left,int right,Symbol *best)

{
  long lVar1;
  Symbol *pSVar2;
  
  if (right != -1 && left != -1) {
    lVar1 = *(long *)&(this->symbols_).
                      super__Vector_base<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>,_std::allocator<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sid].
                      super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
                      ._M_impl.super__Vector_impl_data;
    pSVar2 = GetPairSymbol(this,*(Symbol **)(lVar1 + (long)left * 8),
                           *(Symbol **)(lVar1 + (long)right * 8));
    if (pSVar2 != best && pSVar2 != (Symbol *)0x0) {
      pSVar2->freq = 0;
    }
  }
  return;
}

Assistant:

void Trainer::ResetFreq(int sid, int left, int right, const Symbol *best) {
  if (left == -1 || right == -1) return;
  auto *symbol = GetPairSymbol(symbols_[sid][left], symbols_[sid][right]);
  if (symbol != nullptr && symbol != best) {
    symbol->freq = 0;
  }
}